

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O3

TemplateDictionary * __thiscall
ctemplate::TemplateDictionary::AddIncludeDictionary
          (TemplateDictionary *this,TemplateString include_name)

{
  UnsafeArena *pUVar1;
  small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
  *this_00;
  BaseArena *this_01;
  TemplateDictionary *pTVar2;
  iterator __position;
  IncludeDict *c;
  TemplateId v;
  vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>
  *this_02;
  char *pcVar3;
  data_type *ppvVar4;
  TemplateDictionary *this_03;
  char *in_R9;
  string newname;
  TemplateDictionary *local_80;
  TemplateString local_78;
  undefined1 local_50 [32];
  
  c = this->include_dict_;
  if (c == (IncludeDict *)0x0) {
    c = (IncludeDict *)BaseArena::GetMemory(&this->arena_->super_BaseArena,0x50,8);
    pUVar1 = this->arena_;
    c->size_ = 0;
    (c->functor_).arena_ = pUVar1;
    this->include_dict_ = c;
  }
  v = TemplateString::GetGlobalId(&include_name);
  this_02 = (vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>
             *)find_ptr2<ctemplate::small_map<std::map<unsigned_long,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>*,std::less<unsigned_long>,ctemplate::ArenaAllocator<std::pair<unsigned_long_const,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>*>,ctemplate::UnsafeArena>>,4,std::equal_to<unsigned_long>,ctemplate::TemplateDictionary::map_arena_init>,unsigned_long>
                         (c,v);
  if (this_02 ==
      (vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>
       *)0x0) {
    this_02 = (vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>
               *)BaseArena::GetMemory(&this->arena_->super_BaseArena,0x20,8);
    *(UnsafeArena **)this_02 = this->arena_;
    *(undefined8 *)(this_02 + 8) = 0;
    *(pointer *)(this_02 + 0x10) = (pointer)0x0;
    *(pointer *)(this_02 + 0x18) = (pointer)0x0;
    this_00 = this->include_dict_;
    local_78.is_immutable_ = include_name.is_immutable_;
    local_78._17_7_ = include_name._17_7_;
    local_78.id_ = include_name.id_;
    local_78.ptr_ = include_name.ptr_;
    local_78.length_ = include_name.length_;
    pcVar3 = (char *)TemplateString::GetGlobalId(&local_78);
    local_50._0_8_ = pcVar3;
    ppvVar4 = small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
              ::operator[](this_00,(key_type *)local_50);
    *ppvVar4 = (data_type)this_02;
    if (local_78.id_ == 0) {
      local_50._0_8_ = local_78.ptr_;
      local_50._8_8_ = local_78.length_;
      local_50[0x10] = local_78.is_immutable_;
      local_50._24_8_ = pcVar3;
      TemplateString::AddToGlobalIdToNameMap((TemplateString *)local_50);
    }
  }
  CreateSubdictName_abi_cxx11_
            ((string *)local_50,(TemplateDictionary *)&this->name_,&include_name,
             (TemplateString *)((*(long *)(this_02 + 0x10) - *(long *)(this_02 + 8) >> 3) + 1),
             0x132a9f,in_R9);
  local_78.ptr_ = (char *)local_50._0_8_;
  local_78.length_ = local_50._8_8_;
  local_78._16_8_ = local_78._16_8_ & 0xffffffffffffff00;
  local_78.id_ = 0;
  this_01 = &this->arena_->super_BaseArena;
  pTVar2 = this->template_global_dict_owner_;
  this_03 = (TemplateDictionary *)BaseArena::GetMemory(this_01,0x70,8);
  TemplateDictionary(this_03,&local_78,(UnsafeArena *)this_01,(TemplateDictionary *)0x0,pTVar2);
  __position._M_current = *(TemplateDictionary ***)(this_02 + 0x10);
  local_80 = this_03;
  if (__position._M_current == *(TemplateDictionary ***)(this_02 + 0x18)) {
    std::
    vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>
    ::_M_realloc_insert<ctemplate::TemplateDictionary*const&>(this_02,__position,&local_80);
  }
  else {
    *__position._M_current = this_03;
    *(long *)(this_02 + 0x10) = *(long *)(this_02 + 0x10) + 8;
  }
  pTVar2 = local_80;
  if ((undefined1 *)local_50._0_8_ != local_50 + 0x10) {
    operator_delete((void *)local_50._0_8_);
  }
  return pTVar2;
}

Assistant:

TemplateDictionary* TemplateDictionary::AddIncludeDictionary(
    const TemplateString include_name) {
  LazilyCreateDict(&include_dict_);
  DictVector* dicts = find_ptr2(*include_dict_, include_name.GetGlobalId());
  if (!dicts) {
    dicts = CreateDictVector();
    HashInsert(include_dict_, include_name, dicts);
  }
  assert(dicts != NULL);
  const string newname(CreateSubdictName(name_, include_name,
                                         dicts->size() + 1, ""));
  TemplateDictionary* retval = CreateTemplateSubdict(
      newname, arena_, NULL, template_global_dict_owner_);
  dicts->push_back(retval);
  return retval;
}